

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

void __thiscall re2c::HeaderFile::~HeaderFile(HeaderFile *this)

{
  string content;
  
  if (this->file != (FILE *)0x0) {
    std::__cxx11::stringbuf::str();
    fwrite(content._M_dataplus._M_p,1,content._M_string_length,(FILE *)this->file);
    fclose((FILE *)this->file);
    std::__cxx11::string::~string((string *)&content);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

HeaderFile::~HeaderFile ()
{
	if (file != NULL)
	{
		std::string content = stream.str ();
		fwrite (content.c_str (), 1, content.size (), file);
		fclose (file);
	}
}